

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O2

int s2pred::TriageCompareLineSin2Distance<double>
              (Vector3<double> *x,Vector3<double> *a0,Vector3<double> *a1,double r2,
              Vector3<double> *n,double n1,double n2)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double ax2;
  Vector3<double> local_58;
  double local_38;
  double dStack_30;
  double local_28;
  
  if (r2 < 2.0) {
    GetClosestVertex<double>(&local_58,x,a0,a1,&ax2);
    local_28 = x->c_[2] - local_58.c_[2];
    local_38 = x->c_[0] - local_58.c_[0];
    dStack_30 = x->c_[1] - local_58.c_[1];
    dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                      ((BasicVector<Vector3,_double,_3UL> *)&local_38,n);
    if (ax2 < 0.0) {
      dVar3 = sqrt(ax2);
    }
    else {
      dVar3 = SQRT(ax2);
    }
    dVar3 = (n1 * 6.964101615137754 + 6.153480596427404e-15) * 1.1102230246251565e-16 * dVar3;
    dVar5 = n2 * r2 * (r2 * -0.25 + 1.0);
    dVar4 = dVar2 * dVar2 - dVar5;
    dVar2 = dVar3 * (ABS(dVar2) + ABS(dVar2) + dVar3) + dVar2 * dVar2 * 4.440892098500626e-16 +
            dVar5 * 8.881784197001252e-16 + dVar5 * 6.661338147750939e-16;
    iVar1 = 1;
    if (dVar4 <= dVar2) {
      iVar1 = -(uint)(dVar4 < -dVar2);
    }
    return iVar1;
  }
  return -1;
}

Assistant:

int TriageCompareLineSin2Distance(const Vector3<T>& x, const Vector3<T>& a0,
                                  const Vector3<T>& a1, T r2,
                                  const Vector3<T>& n, T n1, T n2) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // The minimum distance is to a point on the edge interior.  Since the true
  // distance to the edge is always less than 90 degrees, we can return
  // immediately if the limit is 90 degrees or larger.
  if (r2 >= 2.0) return -1;  // distance < limit

  // Otherwise we compute sin^2(distance to edge) to get the best accuracy
  // when the distance limit is small (e.g., S2::kIntersectionError).
  T n2sin2_r = n2 * r2 * (1 - 0.25 * r2);
  T n2sin2_r_error = 6 * T_ERR * n2sin2_r;
  T ax2, xDn = (x - GetClosestVertex(x, a0, a1, &ax2)).DotProd(n);
  T xDn2 = xDn * xDn;
  const T c1 = (((3.5 + 2 * sqrt(3)) * n1 + 32 * sqrt(3) * DBL_ERR) *
                T_ERR * sqrt(ax2));
  T xDn2_error = 4 * T_ERR * xDn2 + (2 * fabs(xDn) + c1) * c1;

  // If we are using extended precision, then it is worthwhile to recompute
  // the length of X more accurately.  Otherwise we use the fact that X is
  // guaranteed to be unit length to with a tolerance of 4 * DBL_ERR.
  if (T_ERR < DBL_ERR) {
    n2sin2_r *= x.Norm2();
    n2sin2_r_error += 4 * T_ERR * n2sin2_r;
  } else {
    n2sin2_r_error += 8 * DBL_ERR * n2sin2_r;
  }
  T diff = xDn2 - n2sin2_r;
  T error = xDn2_error + n2sin2_r_error;
  return (diff > error) ? 1 : (diff < -error) ? -1 : 0;
}